

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

void __thiscall
duckdb::CSVReaderOptions::Verify(CSVReaderOptions *this,MultiFileOptions *file_options)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  byte bVar4;
  BinderException *pBVar5;
  allocator local_39;
  string local_38;
  
  if ((this->rejects_table_name).set_by_user == true) {
    bVar4 = (this->store_rejects).value;
    if (((bool)bVar4 == false) && ((this->store_rejects).set_by_user == true)) {
      pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,
                 "REJECTS_TABLE option is only supported when store_rejects is not manually set to false"
                 ,&local_39);
      BinderException::BinderException(pBVar5,&local_38);
      __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((this->rejects_scan_name).set_by_user != false) {
LAB_018d22e4:
      if (((bVar4 & 1) == 0) && ((this->store_rejects).set_by_user == true)) {
        pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_38,
                   "REJECTS_SCAN option is only supported when store_rejects is not manually set to false"
                   ,&local_39);
        BinderException::BinderException(pBVar5,&local_38);
        __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    if ((this->store_rejects).set_by_user != false) goto LAB_018d2300;
    (this->store_rejects).set_by_user = false;
    (this->store_rejects).value = true;
  }
  else {
    bVar4 = (this->store_rejects).value;
    if ((this->rejects_scan_name).set_by_user == true) goto LAB_018d22e4;
LAB_018d2300:
    if ((bVar4 & 1) == 0) {
      bVar1 = false;
      goto LAB_018d2347;
    }
  }
  bVar1 = (this->ignore_errors).set_by_user;
  if ((this->ignore_errors).value == false) {
    if ((bVar1 & 1U) != 0) {
      pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,
                 "STORE_REJECTS option is only supported when IGNORE_ERRORS is not manually set to false"
                 ,&local_39);
      BinderException::BinderException(pBVar5,&local_38);
      __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
LAB_018d2331:
    (this->ignore_errors).set_by_user = false;
    (this->ignore_errors).value = true;
  }
  else if ((bVar1 & 1U) == 0) goto LAB_018d2331;
  bVar1 = true;
  if (file_options->union_by_name == true) {
    pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,
               "REJECTS_TABLE option is not supported when UNION_BY_NAME is set to true",&local_39);
    BinderException::BinderException(pBVar5,&local_38);
    __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
LAB_018d2347:
  if (this->rejects_limit != 0 && !bVar1) {
    pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,
               "REJECTS_LIMIT option is only supported when REJECTS_TABLE is set to a table name",
               &local_39);
    BinderException::BinderException(pBVar5,&local_38);
    __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = (this->maximum_line_size).set_by_user;
  bVar2 = (this->buffer_size_option).set_by_user;
  if ((bVar2 == true) && ((bVar1 & 1U) != 0)) {
    if ((this->buffer_size_option).value < (this->maximum_line_size).value) {
      pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,
                 "BUFFER_SIZE option was set to %d, while MAX_LINE_SIZE was set to %d. BUFFER_SIZE must have always be set to value bigger than MAX_LINE_SIZE"
                 ,&local_39);
      BinderException::BinderException<unsigned_long,unsigned_long>
                (pBVar5,&local_38,(this->buffer_size_option).value,(this->maximum_line_size).value);
      __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else if (((bVar1 & 1U) != 0) &&
          (uVar3 = (this->maximum_line_size).value, 2000000 < uVar3 && bVar2 == false)) {
    (this->buffer_size_option).value = uVar3 << 4;
    (this->buffer_size_option).set_by_user = false;
  }
  return;
}

Assistant:

void CSVReaderOptions::Verify(MultiFileOptions &file_options) {
	if (rejects_table_name.IsSetByUser() && !store_rejects.GetValue() && store_rejects.IsSetByUser()) {
		throw BinderException("REJECTS_TABLE option is only supported when store_rejects is not manually set to false");
	}
	if (rejects_scan_name.IsSetByUser() && !store_rejects.GetValue() && store_rejects.IsSetByUser()) {
		throw BinderException("REJECTS_SCAN option is only supported when store_rejects is not manually set to false");
	}
	if (rejects_scan_name.IsSetByUser() || rejects_table_name.IsSetByUser()) {
		// Ensure we set store_rejects to true automagically
		store_rejects.Set(true, false);
	}
	// Validate rejects_table options
	if (store_rejects.GetValue()) {
		if (!ignore_errors.GetValue() && ignore_errors.IsSetByUser()) {
			throw BinderException(
			    "STORE_REJECTS option is only supported when IGNORE_ERRORS is not manually set to false");
		}
		// Ensure we set ignore errors to true automagically
		ignore_errors.Set(true, false);
		if (file_options.union_by_name) {
			throw BinderException("REJECTS_TABLE option is not supported when UNION_BY_NAME is set to true");
		}
	}
	if (rejects_limit != 0 && !store_rejects.GetValue()) {
		throw BinderException("REJECTS_LIMIT option is only supported when REJECTS_TABLE is set to a table name");
	}
	// Validate CSV Buffer and max_line_size do not conflict.
	if (buffer_size_option.IsSetByUser() && maximum_line_size.IsSetByUser()) {
		if (buffer_size_option.GetValue() < maximum_line_size.GetValue()) {
			throw BinderException("BUFFER_SIZE option was set to %d, while MAX_LINE_SIZE was set to %d. BUFFER_SIZE "
			                      "must have always be set to value bigger than MAX_LINE_SIZE",
			                      buffer_size_option.GetValue(), maximum_line_size.GetValue());
		}
	} else if (maximum_line_size.IsSetByUser() && maximum_line_size.GetValue() > max_line_size_default) {
		// If the max line size is set by the user and bigger than we have by default, we make it part of our buffer
		// size decision.
		buffer_size_option.Set(CSVBuffer::ROWS_PER_BUFFER * maximum_line_size.GetValue(), false);
	}
}